

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrmpack.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  pointer puVar1;
  uint *puVar2;
  cgltf_buffer_view *pcVar3;
  size_t __n;
  cgltf_buffer *pcVar4;
  pointer pfVar5;
  pointer pcVar6;
  ulong target_index_count;
  _func_void_ptr_void_ptr_cgltf_size *p_Var7;
  undefined8 uVar8;
  cgltf_data *data_00;
  bool bVar9;
  bool bVar10;
  int iVar11;
  cgltf_result cVar12;
  uint32_t uVar13;
  Mesh *pMVar14;
  cgltf_size cVar15;
  double dVar16;
  size_t sVar17;
  size_t sVar18;
  _Rb_tree_node_base *p_Var19;
  cgltf_accessor **ppcVar20;
  double dVar21;
  int iVar22;
  iterator __begin1;
  char *pcVar23;
  ulong uVar24;
  pointer ppMVar25;
  int iVar26;
  cgltf_mesh *pcVar27;
  cgltf_mesh **ppcVar28;
  size_type sVar29;
  cgltf_skin *pcVar30;
  cgltf_size *pcVar31;
  cgltf_size cVar32;
  size_t __n_00;
  cgltf_size index;
  cgltf_accessor *pcVar33;
  iterator __end1;
  cgltf_primitive *pcVar34;
  long lVar35;
  char *local_c58;
  allocator local_c49;
  char *local_c48;
  undefined8 uStack_c40;
  vector<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_> meshes;
  float local_c20;
  int local_c10;
  uint32_t json_size;
  double local_c08;
  undefined8 uStack_c00;
  undefined1 *local_bf0 [2];
  undefined1 local_be0 [16];
  string out_bin;
  vector<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_> local_bb0;
  string out_json;
  undefined1 *local_b78 [2];
  undefined1 local_b68 [16];
  undefined1 *local_b58 [2];
  undefined1 local_b48 [16];
  undefined1 *local_b38 [2];
  undefined1 local_b28 [16];
  cgltf_options write_options;
  cgltf_options options;
  ios_base local_9e0 [272];
  ofstream out_st;
  filebuf local_8c8 [240];
  ios_base local_7d8 [264];
  cgltf_data *data;
  streambuf local_6c0 [504];
  stringstream outss_bin;
  ostream local_4b8 [112];
  ios_base aiStack_448 [264];
  stringstream outss_json;
  ostream local_330 [112];
  ios_base aiStack_2c0 [264];
  stringstream inss_json;
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  iVar22 = 0;
  if (argc < 2) {
LAB_0010cdc2:
    main_cold_1();
    return options.type;
  }
  local_c20 = 1.0;
  iVar26 = 1;
  bVar10 = false;
  local_c58 = (char *)0x0;
  local_c48 = (char *)0x0;
  bVar9 = false;
  do {
    pcVar23 = argv[iVar26];
    iVar11 = strcmp(pcVar23,"-si");
    if (((iVar11 == 0) && (iVar11 = iVar26 + 1, iVar11 < argc)) && ((int)*argv[iVar11] - 0x30U < 10)
       ) {
      dVar16 = atof(argv[iVar11]);
      local_c20 = (float)dVar16;
      iVar26 = iVar11;
    }
    else {
      iVar11 = strcmp(pcVar23,"-sa");
      if (iVar11 == 0) {
        bVar9 = true;
      }
      else if (*pcVar23 == '-') {
        if (((pcVar23[1] == 'i') && (pcVar23[2] == '\0')) &&
           ((iVar26 + 1 < argc && (local_c48 == (char *)0x0)))) {
          local_c48 = argv[iVar26 + 1];
        }
        else {
          if (((pcVar23[1] != 'o') || (pcVar23[2] != '\0')) ||
             ((argc <= iVar26 + 1 || (local_c58 != (char *)0x0)))) {
            if (pcVar23[1] == 'v') {
              if (pcVar23[2] == '\0') {
                iVar22 = 1;
                goto LAB_0010c133;
              }
              iVar11 = strcmp(pcVar23,"-vv");
            }
            else {
              iVar11 = strcmp(pcVar23,"-vv");
            }
            if (iVar11 == 0) {
              iVar22 = 2;
            }
            else if ((pcVar23[1] != 'h') || (bVar10 = true, pcVar23[2] != '\0')) {
              fprintf(_stderr,"Unrecognized option %s\n",pcVar23);
              return 1;
            }
            goto LAB_0010c133;
          }
          local_c58 = argv[iVar26 + 1];
        }
        iVar26 = iVar26 + 1;
      }
      else {
        iVar11 = strcmp(pcVar23,"-vv");
        if (iVar11 == 0) {
          iVar22 = 2;
        }
      }
    }
LAB_0010c133:
    iVar26 = iVar26 + 1;
  } while (iVar26 < argc);
  if ((argc == 2) && (iVar22 != 0)) {
    getVersion_abi_cxx11_();
    iVar22 = 0;
    printf("vrmpack %s\n",options._0_8_);
    ppMVar25 = (pointer)options._0_8_;
    if ((cgltf_memory_options *)options._0_8_ == &options.memory) {
      return 0;
    }
    goto LAB_0010cda9;
  }
  if ((local_c58 == (char *)0x0 || local_c48 == (char *)0x0) || (bVar10)) goto LAB_0010cdc2;
  meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  options.file.release = (_func_void_cgltf_memory_options_ptr_cgltf_file_options_ptr_void_ptr *)0x0;
  options.file.user_data = (void *)0x0;
  options.memory.user_data = (void *)0x0;
  options.file.read =
       (_func_cgltf_result_cgltf_memory_options_ptr_cgltf_file_options_ptr_char_ptr_cgltf_size_ptr_void_ptr_ptr
        *)0x0;
  options.memory.alloc = (_func_void_ptr_void_ptr_cgltf_size *)0x0;
  options.memory.free = (_func_void_void_ptr_void_ptr *)0x0;
  options.type = cgltf_file_type_invalid;
  options._4_4_ = 0;
  options.json_token_count = 0;
  data = (cgltf_data *)0x0;
  cVar12 = cgltf_parse_file(&options,local_c48,&data);
  data_00 = data;
  if (cVar12 == cgltf_result_success) {
    cVar12 = cgltf_load_buffers(&options,data,local_c48);
    if (cVar12 != cgltf_result_success) {
      cgltf_free(data_00);
      pcVar23 = "Failed to load buffers from %s\n";
      goto LAB_0010cdf2;
    }
    dVar16 = (double)data_00->meshes_count;
    if (dVar16 != 0.0) {
      dVar21 = 0.0;
      do {
        if (data_00->meshes[(long)dVar21].primitives_count != 0) {
          pcVar27 = data_00->meshes + (long)dVar21;
          pcVar23 = (char *)0x0;
          local_c08 = dVar21;
          do {
            pcVar34 = pcVar27->primitives + (long)pcVar23;
            pMVar14 = (Mesh *)operator_new(0x88);
            (pMVar14->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pMVar14->vertex_count = 0;
            pMVar14->vertex_positions_stride = 0;
            pMVar14->indices_accessor = (cgltf_accessor *)0x0;
            pMVar14->material = (cgltf_material *)0x0;
            pMVar14->skin = (cgltf_skin *)0x0;
            pMVar14->mesh = (cgltf_mesh *)0x0;
            pMVar14->primitive = (cgltf_primitive *)0x0;
            (pMVar14->name).field_2._M_allocated_capacity = 0;
            *(undefined8 *)((long)&(pMVar14->name).field_2 + 8) = 0;
            (pMVar14->name)._M_dataplus._M_p = (pointer)&(pMVar14->name).field_2;
            (pMVar14->name)._M_string_length = 0;
            (pMVar14->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pMVar14->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pMVar14->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pMVar14->positions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pMVar14->positions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (pMVar14->positions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pMVar14->mesh = pcVar27;
            __s = pcVar27->name;
            _out_st = pMVar14;
            strlen(__s);
            std::__cxx11::string::_M_replace((ulong)pMVar14,0,(char *)0x0,(ulong)__s);
            pMVar14 = _out_st;
            _out_st->primitive = pcVar34;
            cVar32 = data_00->nodes_count;
            local_c48 = pcVar23;
            if (cVar32 != 0) {
              ppcVar28 = &data_00->nodes->mesh;
              do {
                pcVar30 = (cgltf_skin *)ppcVar28[-1];
                if ((((pcVar30 != (cgltf_skin *)0x0) && (*ppcVar28 != (cgltf_mesh *)0x0)) &&
                    (pcVar23 = (*ppcVar28)->name, pcVar23 != (char *)0x0)) &&
                   (iVar22 = strcmp(pcVar23,pcVar27->name), iVar22 == 0)) goto LAB_0010c336;
                ppcVar28 = ppcVar28 + 0x1e;
                cVar32 = cVar32 - 1;
              } while (cVar32 != 0);
            }
            pcVar30 = (cgltf_skin *)0x0;
LAB_0010c336:
            pMVar14->skin = pcVar30;
            pcVar33 = pcVar34->indices;
            pMVar14->indices_accessor = pcVar33;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                      (&pMVar14->indices,pcVar33->count);
            pcVar23 = local_c48;
            pcVar33 = pcVar34->indices;
            cVar32 = pcVar33->count;
            if (cVar32 != 0) {
              puVar1 = (pMVar14->indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              index = 0;
              do {
                cVar15 = cgltf_accessor_read_index(pcVar33,index);
                puVar1[index] = (uint)cVar15;
                index = index + 1;
              } while (cVar32 != index);
            }
            pMVar14 = _out_st;
            cVar32 = _out_st->primitive->attributes_count;
            if (cVar32 != 0) {
              ppcVar20 = &_out_st->primitive->attributes->data;
              pcVar33 = (cgltf_accessor *)0x0;
              do {
                if (*(cgltf_attribute_type *)(ppcVar20 + -1) == cgltf_attribute_type_position) {
                  pcVar33 = *ppcVar20;
                }
                ppcVar20 = ppcVar20 + 4;
                cVar32 = cVar32 - 1;
              } while (cVar32 != 0);
              if (pcVar33 != (cgltf_accessor *)0x0) {
                sVar29 = pcVar33->count * 3;
                std::vector<float,_std::allocator<float>_>::resize(&_out_st->positions,sVar29);
                cgltf_accessor_unpack_floats
                          (pcVar33,(pMVar14->positions).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_start,sVar29);
                cVar32 = pcVar33->stride;
                pMVar14->vertex_count = pcVar33->count;
                pMVar14->vertex_positions_stride = cVar32;
              }
            }
            if (meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<VRM::Mesh*,std::allocator<VRM::Mesh*>>::
              _M_realloc_insert<VRM::Mesh*const&>
                        ((vector<VRM::Mesh*,std::allocator<VRM::Mesh*>> *)&meshes,
                         (iterator)
                         meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Mesh **)&out_st);
            }
            else {
              *meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish = _out_st;
              meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            pcVar23 = pcVar23 + 1;
          } while (pcVar23 < (char *)pcVar27->primitives_count);
          dVar16 = (double)data_00->meshes_count;
          dVar21 = local_c08;
        }
        dVar21 = (double)((long)dVar21 + 1);
      } while ((ulong)dVar21 < (ulong)dVar16);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&inss_json);
    sVar17 = strlen(local_c58);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_c58,sVar17);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".in.json",8);
    write_options.file.release =
         (_func_void_cgltf_memory_options_ptr_cgltf_file_options_ptr_void_ptr *)0x0;
    write_options.file.user_data = (void *)0x0;
    write_options.memory.user_data = (void *)0x0;
    write_options.file.read =
         (_func_cgltf_result_cgltf_memory_options_ptr_cgltf_file_options_ptr_char_ptr_cgltf_size_ptr_void_ptr_ptr
          *)0x0;
    write_options.memory.alloc = (_func_void_ptr_void_ptr_cgltf_size *)0x0;
    write_options.memory.free = (_func_void_void_ptr_void_ptr *)0x0;
    write_options.type = cgltf_file_type_invalid;
    write_options._4_4_ = 0;
    write_options.json_token_count = 0;
    std::__cxx11::stringbuf::str();
    cgltf_write_file(&write_options,(char *)options._0_8_,data_00);
    if ((cgltf_memory_options *)options._0_8_ != &options.memory) {
      operator_delete((void *)options._0_8_);
    }
    if (meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar24 = 0;
      do {
        pMVar14 = meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar24];
        sVar29 = (long)(pMVar14->indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pMVar14->indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        local_c48 = (char *)((double)(sVar29 / 3) * (double)local_c20);
        uStack_c40 = 0;
        local_c08 = (double)local_c48 - 9.223372036854776e+18;
        uStack_c00 = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&options,sVar29,
                   (allocator_type *)&data);
        target_index_count =
             ((long)local_c08 & (long)(double)local_c48 >> 0x3f | (long)(double)local_c48) * 3;
        puVar2 = (pMVar14->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar18 = meshopt_simplify((uint *)options._0_8_,puVar2,
                                  (long)(pMVar14->indices).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >>
                                  2,(pMVar14->positions).
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start,pMVar14->vertex_count,
                                  pMVar14->vertex_positions_stride,target_index_count,0.01,
                                  (float *)0x0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&options,sVar18);
        uVar8 = options._0_8_;
        puVar2 = (pMVar14->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        (pMVar14->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)options._0_8_;
        puVar1 = (pMVar14->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        p_Var7 = (_func_void_ptr_void_ptr_cgltf_size *)
                 (pMVar14->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        (pMVar14->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)options.json_token_count;
        (pMVar14->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)options.memory.alloc;
        options.memory.alloc = p_Var7;
        if ((bVar9) &&
           (sVar18 = (long)(options.json_token_count - options._0_8_) >> 2,
           target_index_count < sVar18)) {
          options._0_8_ = puVar2;
          options.json_token_count = (cgltf_size)puVar1;
          sVar18 = meshopt_simplifySloppy
                             (puVar2,(uint *)uVar8,sVar18,
                              (pMVar14->positions).super__Vector_base<float,_std::allocator<float>_>
                              ._M_impl.super__Vector_impl_data._M_start,pMVar14->vertex_count,
                              pMVar14->vertex_positions_stride,target_index_count,0.1,(float *)0x0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&options,sVar18);
          puVar2 = (pMVar14->indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar1 = (pMVar14->indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          p_Var7 = (_func_void_ptr_void_ptr_cgltf_size *)
                   (pMVar14->indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          (pMVar14->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)options._0_8_;
          (pMVar14->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)options.json_token_count;
          (pMVar14->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)options.memory.alloc;
          options.memory.alloc = p_Var7;
        }
        options.json_token_count = (cgltf_size)puVar1;
        options._0_8_ = puVar2;
        if (options._0_8_ != 0) {
          operator_delete((void *)options._0_8_);
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 < (ulong)((long)meshes.
                                      super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)meshes.
                                      super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 3));
    }
    std::vector<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>::vector(&local_bb0,&meshes);
    options.memory.free = (_func_void_void_ptr_void_ptr *)&options.json_token_count;
    options.json_token_count = options.json_token_count & 0xffffffff00000000;
    options.memory.alloc = (_func_void_ptr_void_ptr_cgltf_size *)0x0;
    options.file.read =
         (_func_cgltf_result_cgltf_memory_options_ptr_cgltf_file_options_ptr_char_ptr_cgltf_size_ptr_void_ptr_ptr
          *)0x0;
    options.memory.user_data = options.memory.free;
    if (local_bb0.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_bb0.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ppMVar25 = local_bb0.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        pMVar14 = *ppMVar25;
        pcVar33 = pMVar14->indices_accessor;
        puVar1 = (pMVar14->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar17 = (long)(pMVar14->indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar1;
        pcVar33->count = (long)sVar17 >> 2;
        pcVar3 = pcVar33->buffer_view;
        pcVar3->size = sVar17;
        memcpy((void *)((long)pcVar3->buffer->data + pcVar3->offset),puVar1,sVar17);
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)&options,&pMVar14->indices_accessor->buffer_view->buffer_index);
        ppMVar25 = ppMVar25 + 1;
        p_Var19 = (_Rb_tree_node_base *)options.memory.free;
      } while (ppMVar25 !=
               local_bb0.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
      for (; p_Var19 != (_Rb_tree_node_base *)&options.json_token_count;
          p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
        sVar17 = *(size_t *)(p_Var19 + 1);
        pcVar4 = data_00->buffers + sVar17;
        local_c48 = (char *)malloc(data_00->buffers[sVar17].size);
        cVar32 = data_00->buffer_views_count;
        if (cVar32 == 0) {
          __n_00 = 0;
        }
        else {
          pcVar31 = &data_00->buffer_views->offset;
          __n_00 = 0;
          do {
            if (pcVar31[0x10] == sVar17) {
              __n = pcVar31[1];
              memcpy(local_c48 + __n_00,(void *)((long)pcVar4->data + *pcVar31),__n);
              *pcVar31 = __n_00;
              __n_00 = __n_00 + (__n + 3 & 0xfffffffffffffffc);
            }
            pcVar31 = pcVar31 + 0x12;
            cVar32 = cVar32 - 1;
          } while (cVar32 != 0);
        }
        pcVar23 = local_c48;
        pcVar4->size = __n_00;
        memcpy(pcVar4->data,local_c48,__n_00);
        free(pcVar23);
      }
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)&options);
    if (local_bb0.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_bb0.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&outss_json);
    std::__cxx11::stringstream::stringstream((stringstream *)&outss_bin);
    sVar17 = strlen(local_c58);
    std::__ostream_insert<char,std::char_traits<char>>(local_330,local_c58,sVar17);
    std::__ostream_insert<char,std::char_traits<char>>(local_330,".json",5);
    sVar17 = strlen(local_c58);
    std::__ostream_insert<char,std::char_traits<char>>(local_4b8,local_c58,sVar17);
    std::__ostream_insert<char,std::char_traits<char>>(local_4b8,".bin",4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    cgltf_write_file(&write_options,out_json._M_dataplus._M_p,data_00);
    local_b58[0] = local_b48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b58,out_bin._M_dataplus._M_p,
               out_bin._M_dataplus._M_p + out_bin._M_string_length);
    std::ofstream::ofstream(&options);
    std::ofstream::open((char *)&options,(_Ios_Openmode)local_b58[0]);
    if (data_00->buffers_count != 0) {
      lVar35 = 0;
      uVar24 = 0;
      do {
        pcVar4 = data_00->buffers;
        std::ostream::write((char *)&options,(long)&pcVar4->size + lVar35);
        std::ostream::write((char *)&options,0x11c1d8);
        std::ostream::write((char *)&options,*(long *)((long)&pcVar4->data + lVar35));
        uVar24 = uVar24 + 1;
        lVar35 = lVar35 + 0x38;
      } while (uVar24 < data_00->buffers_count);
    }
    std::ofstream::close();
    uVar8 = __filebuf;
    pMVar14 = _VTT;
    options._0_8_ = _VTT;
    *(undefined8 *)
     ((long)&options.type +
     (long)_VTT[-1].positions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start) = __filebuf;
    std::filebuf::~filebuf((filebuf *)&options.json_token_count);
    std::ios_base::~ios_base(local_9e0);
    if (local_b58[0] != local_b48) {
      operator_delete(local_b58[0]);
    }
    std::__cxx11::string::string((string *)local_b38,local_c58,&local_c49);
    local_b78[0] = local_b68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b78,out_json._M_dataplus._M_p,
               out_json._M_dataplus._M_p + out_json._M_string_length);
    local_bf0[0] = local_be0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_bf0,out_bin._M_dataplus._M_p,
               out_bin._M_dataplus._M_p + out_bin._M_string_length);
    std::ifstream::ifstream(&options,(string *)local_b78,_S_bin);
    std::ifstream::ifstream(&data,(string *)local_bf0,_S_bin);
    std::ofstream::ofstream(&out_st,(string *)local_b38,_S_trunc|_S_bin);
    std::istream::seekg((long)&options,_S_beg);
    uVar13 = std::istream::tellg();
    json_size = uVar13;
    std::istream::seekg((long)&options,_S_beg);
    std::istream::seekg((long)&data,_S_beg);
    iVar22 = std::istream::tellg();
    std::istream::seekg((long)&data,_S_beg);
    local_c10 = uVar13 + iVar22 + 0x14;
    std::ostream::write((char *)&out_st,0x11c1dc);
    std::ostream::write((char *)&out_st,0x11c1e0);
    std::ostream::write((char *)&out_st,(long)&local_c10);
    std::ostream::write((char *)&out_st,(long)&json_size);
    std::ostream::write((char *)&out_st,0x11c1e4);
    std::ostream::operator<<((ostream *)&out_st,(streambuf *)&options.memory);
    std::ostream::operator<<((ostream *)&out_st,local_6c0);
    std::ofstream::close();
    _out_st = pMVar14;
    *(undefined8 *)
     (&out_st +
     (long)pMVar14[-1].positions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start) = uVar8;
    std::filebuf::~filebuf(local_8c8);
    std::ios_base::~ios_base(local_7d8);
    std::ifstream::~ifstream(&data);
    std::ifstream::~ifstream(&options);
    if (local_bf0[0] != local_be0) {
      operator_delete(local_bf0[0]);
    }
    if (local_b78[0] != local_b68) {
      operator_delete(local_b78[0]);
    }
    if (local_b38[0] != local_b28) {
      operator_delete(local_b38[0]);
    }
    if (meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar24 = 0;
      do {
        pMVar14 = meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar24];
        if (pMVar14 != (Mesh *)0x0) {
          pfVar5 = (pMVar14->positions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (pfVar5 != (pointer)0x0) {
            operator_delete(pfVar5);
          }
          puVar1 = (pMVar14->indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (puVar1 != (pointer)0x0) {
            operator_delete(puVar1);
          }
          pcVar6 = (pMVar14->name)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar6 != &(pMVar14->name).field_2) {
            operator_delete(pcVar6);
          }
        }
        operator_delete(pMVar14);
        uVar24 = uVar24 + 1;
      } while (uVar24 < (ulong)((long)meshes.
                                      super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)meshes.
                                      super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    cgltf_free(data_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out_bin._M_dataplus._M_p != &out_bin.field_2) {
      operator_delete(out_bin._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out_json._M_dataplus._M_p != &out_json.field_2) {
      operator_delete(out_json._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&outss_bin);
    std::ios_base::~ios_base(aiStack_448);
    std::__cxx11::stringstream::~stringstream((stringstream *)&outss_json);
    std::ios_base::~ios_base(aiStack_2c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&inss_json);
    std::ios_base::~ios_base(aiStack_138);
    iVar22 = 0;
  }
  else {
    pcVar23 = "Failed to parse file %s\n";
LAB_0010cdf2:
    fprintf(_stderr,pcVar23,local_c48);
    iVar22 = 4;
  }
  ppMVar25 = meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    return iVar22;
  }
LAB_0010cda9:
  operator_delete(ppMVar25);
  return iVar22;
}

Assistant:

int main(int argc, char** argv)
{
	Settings settings = defaults();

	const char* input = 0;
	const char* output = 0;
	bool help = false;

	std::vector<const char*> testinputs;

	for (int i = 1; i < argc; ++i)
	{
		const char* arg = argv[i];

		if (strcmp(arg, "-si") == 0 && i + 1 < argc && isdigit(argv[i + 1][0]))
		{
			settings.simplify_threshold = float(atof(argv[++i]));
		}
		else if (strcmp(arg, "-sa") == 0)
		{
			settings.simplify_aggressive = true;
		}
		else if (strcmp(arg, "-i") == 0 && i + 1 < argc && !input)
		{
			input = argv[++i];
		}
		else if (strcmp(arg, "-o") == 0 && i + 1 < argc && !output)
		{
			output = argv[++i];
		}
		else if (strcmp(arg, "-v") == 0)
		{
			settings.verbose = 1;
		}
		else if (strcmp(arg, "-vv") == 0)
		{
			settings.verbose = 2;
		}
		else if (strcmp(arg, "-h") == 0)
		{
			help = true;
		}
		else if (arg[0] == '-')
		{
			fprintf(stderr, "Unrecognized option %s\n", arg);
			return 1;
		}
	}

	// shortcut for vrmpack -v
	if (settings.verbose && argc == 2)
	{
		printf("vrmpack %s\n", getVersion().c_str());
		return 0;
	}

	if (!input || !output || help)
	{
		fprintf(stderr, "vrmpack %s\n", getVersion().c_str());
		fprintf(stderr, "Usage: vrmpack [options] -i input -o output\n");

		if (help)
		{
			fprintf(stderr, "\nBasics:\n");
			fprintf(stderr, "\t-i file: input file to process, .vrm\n");
			fprintf(stderr, "\t-o file: output file path, .vrm\n");
			fprintf(stderr, "\nSimplification:\n");
			fprintf(stderr, "\t-si R: simplify meshes to achieve the ratio R (default: 1; R should be between 0 and 1)\n");
			fprintf(stderr, "\t-sa: aggressively simplify to the target ratio disregarding quality\n");
			fprintf(stderr, "\nMiscellaneous:\n");
			fprintf(stderr, "\t-v: verbose output (print version when used without other options)\n");
			fprintf(stderr, "\t-h: display this help and exit\n");
		}
		else
		{
			fprintf(stderr, "\nBasics:\n");
			fprintf(stderr, "\t-i file: input file to process, .vrm\n");
			fprintf(stderr, "\t-o file: output file path, .vrm\n");
			fprintf(stderr, "\t-si R: simplify meshes to achieve the ratio R (default: 1; R should be between 0 and 1)\n");
			fprintf(stderr, "\nRun vrmpack -h to display a full list of options\n");
		}

		return 1;
	}

	return vrmpack(input, output, settings);
}